

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O0

bool __thiscall Am_Value::operator!=(Am_Value *this,char *test_value)

{
  bool bVar1;
  uint uVar2;
  char *test_value_local;
  Am_Value *this_local;
  
  uVar2 = (uint)this->type;
  if ((uVar2 - 2 < 2) || (uVar2 == 9)) {
    if ((this->value).wrapper_value == (Am_Wrapper *)0x0) {
      return test_value != (char *)0x0;
    }
  }
  else if (uVar2 == 0x8008) {
    bVar1 = Am_String_Data::operator==((Am_String_Data *)(this->value).wrapper_value,test_value);
    return (bool)((bVar1 ^ 0xffU) & 1);
  }
  return true;
}

Assistant:

bool
Am_Value::operator!=(const char *test_value) const
{
  switch (type) {
  case Am_STRING:
    return !(*(Am_String_Data *)value.wrapper_value == test_value);
  case Am_INT:
  case Am_LONG:
  case Am_VOIDPTR:
    if (!value.voidptr_value)
      return test_value != nullptr;
  default:
    return true;
  }
}